

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_test.cc
# Opt level: O1

void __thiscall
JsonTest_EncodeNegativeEnum_Test::~JsonTest_EncodeNegativeEnum_Test
          (JsonTest_EncodeNegativeEnum_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(JsonTest, EncodeNegativeEnum) {
  upb::Arena a;

  upb_test_Box* foo = upb_test_Box_new(a.ptr());
  upb_test_Box_set_last_tag(foo, upb_test_Z_BAZ);

  EXPECT_EQ(R"({"lastTag":"Z_BAZ"})", JsonEncode(foo, 0));
  EXPECT_EQ(R"({"lastTag":-2})",
            JsonEncode(foo, upb_JsonEncode_FormatEnumsAsIntegers));
}